

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_BoxBoNum(Bac_Ntk_t *p,int i)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int s;
  int i_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsBox(p,i);
  local_14 = i;
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsBox(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                  ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
  }
  do {
    local_14 = local_14 + 1;
    iVar1 = Bac_NtkObjNum(p);
    bVar2 = false;
    if (local_14 < iVar1) {
      iVar1 = Bac_ObjIsBo(p,local_14);
      bVar2 = iVar1 != 0;
    }
  } while (bVar2);
  return local_14 - (i + 1);
}

Assistant:

static inline int            Bac_BoxBoNum( Bac_Ntk_t * p, int i )            { int s = i+1; assert(Bac_ObjIsBox(p, i)); while (++i < Bac_NtkObjNum(p) && Bac_ObjIsBo(p, i)) {} return i - s;  }